

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

door_t * get_door(doorindex_t index)

{
  long lVar1;
  door_t *door;
  doorindex_t index_local;
  
  lVar1 = (long)(int)((index & 0xffffff7f) << 1);
  door = doors + lVar1;
  if ((index & 0x80) != 0) {
    door = doors + lVar1 + 1;
  }
  return door;
}

Assistant:

const door_t *get_door(doorindex_t index)
{
  const door_t *door; /* was HL */

  assert((index & ~door_REVERSE) < door_MAX);

  /* Conv: Mask before multiplication to avoid overflow. */
  door = &doors[(index & ~door_REVERSE) * 2];
  if (index & door_REVERSE)
    door++;

  return door;
}